

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::ScalablePipeline(ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                   *this,size_t num_lines,
                  __normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
                  first,__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
                        last)

{
  long in_RSI;
  Pipe<std::function<void_(tf::Pipeflow_&)>_> *in_RDI;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  *in_stack_00000050;
  char (*in_stack_00000120) [28];
  size_t in_stack_00000128;
  char *in_stack_00000130;
  queue<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff50;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<tf::Task,_std::allocator<tf::Task>_> *in_stack_ffffffffffffff70;
  Pipe<std::function<void_(tf::Pipeflow_&)>_> *this_00;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  *this_01;
  __normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
  last_00;
  __normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
  first_00;
  
  last_00._M_current = in_RDI;
  Graph::Graph((Graph *)0x1082d1);
  ((last_00._M_current)->_callable).super__Function_base._M_manager = (_Manager_type)0x0;
  this_01 = (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
             *)&((last_00._M_current)->_callable)._M_invoker;
  std::
  vector<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
  ::vector((vector<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
            *)0x1082ec);
  first_00._M_current =
       (Pipe<std::function<void_(tf::Pipeflow_&)>_> *)
       ((long)&last_00._M_current[1]._callable.super__Function_base._M_functor + 8);
  std::allocator<tf::Task>::allocator((allocator<tf::Task> *)0x10831c);
  std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (allocator_type *)in_stack_ffffffffffffff60);
  std::allocator<tf::Task>::~allocator((allocator<tf::Task> *)0x10833f);
  this_00 = in_RDI + 2;
  std::allocator<tf::Pipeflow>::allocator((allocator<tf::Pipeflow> *)0x10836c);
  std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
            ((vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> *)this_00,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<tf::Pipeflow>::~allocator((allocator<tf::Pipeflow> *)0x10838f);
  std::
  unique_ptr<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void(tf::Pipeflow&)>>*,std::vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>>>::Line[],std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void(tf::Pipeflow&)>>*,std::vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>>>::Line[]>>
  ::
  unique_ptr<std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void(tf::Pipeflow&)>>*,std::vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>>>::Line[]>,void>
            ((unique_ptr<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[],_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
              *)in_stack_ffffffffffffff50);
  std::
  queue<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
  ::
  queue<std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>,void>
            (in_stack_ffffffffffffff50);
  std::
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)0x1083cd);
  std::
  unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
  ::unordered_map((unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
                   *)0x1083e3);
  in_RDI[7]._callable.super__Function_base._M_manager = (_Manager_type)0x0;
  if (in_RSI == 0) {
    throw_re<char_const(&)[28]>(in_stack_00000130,in_stack_00000128,in_stack_00000120);
  }
  reset(this_01,first_00,last_00);
  _build(in_stack_00000050);
  return;
}

Assistant:

ScalablePipeline<P>::ScalablePipeline(size_t num_lines, P first, P last) :
  _tasks     (num_lines + 1),
  _pipeflows (num_lines) {

  if(num_lines == 0) {
    TF_THROW("must have at least one line");
  }

  reset(first, last);
  _build();
}